

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImVec2 CalcSizeAutoFit(ImGuiWindow *window,ImVec2 *size_contents)

{
  ImGuiContext *pIVar1;
  uint uVar2;
  uint uVar3;
  ImVec2 IVar4;
  ImVec2 IVar5;
  undefined1 auVar6 [16];
  float fVar7;
  float fVar8;
  ImVec2 local_20;
  
  pIVar1 = GImGui;
  if (((uint)window->Flags >> 0x19 & 1) == 0) {
    local_20 = (GImGui->Style).WindowMinSize;
    auVar6._8_8_ = 0;
    auVar6._0_4_ = local_20.x;
    auVar6._4_4_ = local_20.y;
    if ((window->Flags & 0x14000000U) != 0) {
      auVar6 = minps(auVar6,_DAT_00186b20);
      local_20 = auVar6._0_8_;
    }
    IVar4 = (GImGui->Style).DisplaySafeAreaPadding;
    fVar7 = IVar4.x;
    fVar8 = IVar4.y;
    IVar4 = (GImGui->IO).DisplaySize;
    fVar7 = IVar4.x - (fVar7 + fVar7);
    fVar8 = IVar4.y - (fVar8 + fVar8);
    uVar2 = -(uint)(fVar7 <= local_20.x);
    uVar3 = -(uint)(fVar8 <= local_20.y);
    IVar4 = ImClamp(size_contents,&local_20,
                    (ImVec2)(CONCAT44(~uVar3 & (uint)fVar8,~uVar2 & (uint)fVar7) |
                            CONCAT44((uint)local_20.y & uVar3,(uint)local_20.x & uVar2)));
    IVar5 = CalcSizeAfterConstraint(window,IVar4);
    if (IVar5.x < size_contents->x) {
      fVar8 = IVar4.x;
      if ((window->Flags & 0x808U) == 0x800) {
        IVar4.y = IVar4.y + (pIVar1->Style).ScrollbarSize;
        IVar4.x = fVar8;
      }
    }
    if ((IVar5.y < size_contents->y) && ((window->Flags & 8) == 0)) {
      IVar4.x = IVar4.x + (pIVar1->Style).ScrollbarSize;
    }
  }
  else {
    IVar4 = *size_contents;
  }
  return IVar4;
}

Assistant:

static ImVec2 CalcSizeAutoFit(ImGuiWindow* window, const ImVec2& size_contents)
{
    ImGuiContext& g = *GImGui;
    ImGuiStyle& style = g.Style;
    if (window->Flags & ImGuiWindowFlags_Tooltip)
    {
        // Tooltip always resize
        return size_contents;
    }
    else
    {
        // When the window cannot fit all contents (either because of constraints, either because screen is too small): we are growing the size on the other axis to compensate for expected scrollbar. FIXME: Might turn bigger than DisplaySize-WindowPadding.
        const bool is_popup = (window->Flags & ImGuiWindowFlags_Popup) != 0;
        const bool is_menu = (window->Flags & ImGuiWindowFlags_ChildMenu) != 0;
        ImVec2 size_min = style.WindowMinSize;
        if (is_popup || is_menu) // Popups and menus bypass style.WindowMinSize by default, but we give then a non-zero minimum size to facilitate understanding problematic cases (e.g. empty popups)
            size_min = ImMin(size_min, ImVec2(4.0f, 4.0f));
        ImVec2 size_auto_fit = ImClamp(size_contents, size_min, ImMax(size_min, g.IO.DisplaySize - style.DisplaySafeAreaPadding * 2.0f));
        ImVec2 size_auto_fit_after_constraint = CalcSizeAfterConstraint(window, size_auto_fit);
        if (size_auto_fit_after_constraint.x < size_contents.x && !(window->Flags & ImGuiWindowFlags_NoScrollbar) && (window->Flags & ImGuiWindowFlags_HorizontalScrollbar))
            size_auto_fit.y += style.ScrollbarSize;
        if (size_auto_fit_after_constraint.y < size_contents.y && !(window->Flags & ImGuiWindowFlags_NoScrollbar))
            size_auto_fit.x += style.ScrollbarSize;
        return size_auto_fit;
    }
}